

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

ly_module_imp_clb ly_ctx_get_module_imp_clb(ly_ctx *ctx,void **user_data)

{
  LY_ERR *pLVar1;
  
  if (ctx != (ly_ctx *)0x0) {
    if (user_data != (void **)0x0) {
      *user_data = ctx->imp_clb_data;
    }
    return ctx->imp_clb;
  }
  pLVar1 = ly_errno_location();
  *pLVar1 = LY_EINVAL;
  return (ly_module_imp_clb)0x0;
}

Assistant:

API ly_module_imp_clb
ly_ctx_get_module_imp_clb(const struct ly_ctx *ctx, void **user_data)
{
    if (!ctx) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (user_data) {
        *user_data = ctx->imp_clb_data;
    }
    return ctx->imp_clb;
}